

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

shared_ptr<chatra::Node> __thiscall chatra::createNullNode(chatra *this,Token *templateToken)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<chatra::Node> sVar2;
  Token *local_28;
  undefined1 local_19;
  Token *local_18;
  Token *templateToken_local;
  shared_ptr<chatra::Node> *n;
  
  local_19 = 0;
  local_18 = templateToken;
  templateToken_local = (Token *)this;
  std::make_shared<chatra::Node>();
  peVar1 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  peVar1->type = Name;
  peVar1 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  local_28 = local_18;
  std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>::push_back
            (&peVar1->tokens,&local_28);
  peVar1 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  peVar1->sid = Null;
  sVar2.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<chatra::Node>)
         sVar2.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<Node> createNullNode(const Token& templateToken) {
	auto n = std::make_shared<Node>();
	n->type = NodeType::Name;
	n->tokens.push_back(&templateToken);
	n->sid = StringId::Null;
	return n;
}